

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O2

void mxx::
     local_exscan<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::plus<int>>
               (int *begin,int *end,undefined4 *out)

{
  int iVar1;
  T tmp;
  int iVar2;
  int *piVar3;
  
  if (end != begin) {
    iVar2 = *begin;
    *out = 0;
    piVar3 = out + 1;
    for (begin = begin + 1; begin != end; begin = begin + 1) {
      iVar1 = *begin;
      *piVar3 = iVar2;
      piVar3 = piVar3 + 1;
      iVar2 = iVar1 + iVar2;
    }
  }
  return;
}

Assistant:

void local_exscan(InIterator begin, InIterator end, OutIterator out, Func func) {
    // return if there's nothing here
    if (std::distance(begin, end) == 0)
        return;
    typedef typename std::iterator_traits<OutIterator>::value_type T;

    // start from first element
    T val = *begin;
    *out = T();
    ++begin;
    ++out;

    // calculate the exclusive prefix sum
    while (begin != end) {
        T tmp = val;
        val = func(val,*begin);
        *out = tmp;
        ++begin;
        ++out;
    }
}